

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cpp
# Opt level: O2

void BuildAndStoreCommandPrefixCode(BrotliOnePassArena *s,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  HuffmanTree *tree;
  uint8_t *depth_00;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  
  depth = s->tmp_depth;
  switchD_016d4fed::default(depth,0,0x2c0);
  tree = s->tree;
  duckdb_brotli::BrotliCreateHuffmanTree(s->cmd_histo,0x40,0xf,tree,s->cmd_depth);
  depth_00 = s->cmd_depth + 0x40;
  duckdb_brotli::BrotliCreateHuffmanTree(s->cmd_histo + 0x40,0x40,0xe,tree,depth_00);
  *(undefined8 *)(s->tmp_depth + 0x10) = *(undefined8 *)(s->cmd_depth + 0x10);
  uVar1 = *(undefined8 *)(s->cmd_depth + 8);
  *(undefined8 *)s->tmp_depth = *(undefined8 *)s->cmd_depth;
  *(undefined8 *)(s->tmp_depth + 8) = uVar1;
  uVar2 = *(undefined4 *)(s->cmd_depth + 0x18);
  uVar3 = *(undefined4 *)(s->cmd_depth + 0x1c);
  uVar4 = *(undefined4 *)(s->cmd_depth + 0x20);
  uVar5 = *(undefined4 *)(s->cmd_depth + 0x24);
  uVar7 = *(undefined4 *)(s->cmd_depth + 0x28);
  uVar8 = *(undefined4 *)(s->cmd_depth + 0x2c);
  uVar6 = *(undefined4 *)(s->cmd_depth + 0x34);
  *(undefined4 *)(s->tmp_depth + 0x28) = *(undefined4 *)(s->cmd_depth + 0x30);
  *(undefined4 *)(s->tmp_depth + 0x2c) = uVar6;
  *(undefined4 *)(s->tmp_depth + 0x30) = uVar4;
  *(undefined4 *)(s->tmp_depth + 0x34) = uVar5;
  *(undefined4 *)(s->tmp_depth + 0x18) = uVar7;
  *(undefined4 *)(s->tmp_depth + 0x1c) = uVar8;
  *(undefined4 *)(s->tmp_depth + 0x20) = uVar2;
  *(undefined4 *)(s->tmp_depth + 0x24) = uVar3;
  *(undefined8 *)(s->tmp_depth + 0x38) = *(undefined8 *)(s->cmd_depth + 0x38);
  duckdb_brotli::BrotliConvertBitDepthsToSymbols(depth,0x40,s->tmp_bits);
  uVar1 = *(undefined8 *)s->tmp_bits;
  uVar9 = *(undefined8 *)(s->tmp_bits + 4);
  uVar10 = *(undefined8 *)(s->tmp_bits + 8);
  uVar11 = *(undefined8 *)(s->tmp_bits + 0xc);
  uVar12 = *(undefined8 *)(s->tmp_bits + 0x14);
  uVar13 = *(undefined8 *)(s->tmp_bits + 0x18);
  uVar14 = *(undefined8 *)(s->tmp_bits + 0x1c);
  *(undefined8 *)(s->cmd_bits + 0x10) = *(undefined8 *)(s->tmp_bits + 0x10);
  *(undefined8 *)(s->cmd_bits + 0x14) = uVar12;
  *(undefined8 *)(s->cmd_bits + 8) = uVar10;
  *(undefined8 *)(s->cmd_bits + 0xc) = uVar11;
  *(undefined8 *)s->cmd_bits = uVar1;
  *(undefined8 *)(s->cmd_bits + 4) = uVar9;
  uVar1 = *(undefined8 *)(s->tmp_bits + 0x24);
  *(undefined8 *)(s->cmd_bits + 0x18) = *(undefined8 *)(s->tmp_bits + 0x20);
  *(undefined8 *)(s->cmd_bits + 0x1c) = uVar1;
  uVar1 = *(undefined8 *)(s->tmp_bits + 0x34);
  *(undefined8 *)(s->cmd_bits + 0x20) = *(undefined8 *)(s->tmp_bits + 0x30);
  *(undefined8 *)(s->cmd_bits + 0x24) = uVar1;
  *(undefined8 *)(s->cmd_bits + 0x28) = uVar13;
  *(undefined8 *)(s->cmd_bits + 0x2c) = uVar14;
  uVar1 = *(undefined8 *)(s->tmp_bits + 0x2c);
  *(undefined8 *)(s->cmd_bits + 0x30) = *(undefined8 *)(s->tmp_bits + 0x28);
  *(undefined8 *)(s->cmd_bits + 0x34) = uVar1;
  uVar1 = *(undefined8 *)(s->tmp_bits + 0x3c);
  *(undefined8 *)(s->cmd_bits + 0x38) = *(undefined8 *)(s->tmp_bits + 0x38);
  *(undefined8 *)(s->cmd_bits + 0x3c) = uVar1;
  duckdb_brotli::BrotliConvertBitDepthsToSymbols(depth_00,0x40,s->cmd_bits + 0x40);
  s->tmp_depth[0x28] = '\0';
  s->tmp_depth[0x29] = '\0';
  s->tmp_depth[0x2a] = '\0';
  s->tmp_depth[0x2b] = '\0';
  s->tmp_depth[0x2c] = '\0';
  s->tmp_depth[0x2d] = '\0';
  s->tmp_depth[0x2e] = '\0';
  s->tmp_depth[0x2f] = '\0';
  s->tmp_depth[0x30] = '\0';
  s->tmp_depth[0x31] = '\0';
  s->tmp_depth[0x32] = '\0';
  s->tmp_depth[0x33] = '\0';
  s->tmp_depth[0x34] = '\0';
  s->tmp_depth[0x35] = '\0';
  s->tmp_depth[0x36] = '\0';
  s->tmp_depth[0x37] = '\0';
  s->tmp_depth[0x18] = '\0';
  s->tmp_depth[0x19] = '\0';
  s->tmp_depth[0x1a] = '\0';
  s->tmp_depth[0x1b] = '\0';
  s->tmp_depth[0x1c] = '\0';
  s->tmp_depth[0x1d] = '\0';
  s->tmp_depth[0x1e] = '\0';
  s->tmp_depth[0x1f] = '\0';
  s->tmp_depth[0x20] = '\0';
  s->tmp_depth[0x21] = '\0';
  s->tmp_depth[0x22] = '\0';
  s->tmp_depth[0x23] = '\0';
  s->tmp_depth[0x24] = '\0';
  s->tmp_depth[0x25] = '\0';
  s->tmp_depth[0x26] = '\0';
  s->tmp_depth[0x27] = '\0';
  s->tmp_depth[0x38] = '\0';
  s->tmp_depth[0x39] = '\0';
  s->tmp_depth[0x3a] = '\0';
  s->tmp_depth[0x3b] = '\0';
  s->tmp_depth[0x3c] = '\0';
  s->tmp_depth[0x3d] = '\0';
  s->tmp_depth[0x3e] = '\0';
  s->tmp_depth[0x3f] = '\0';
  s->tmp_depth[8] = '\0';
  s->tmp_depth[9] = '\0';
  s->tmp_depth[10] = '\0';
  s->tmp_depth[0xb] = '\0';
  s->tmp_depth[0xc] = '\0';
  s->tmp_depth[0xd] = '\0';
  s->tmp_depth[0xe] = '\0';
  s->tmp_depth[0xf] = '\0';
  s->tmp_depth[0x10] = '\0';
  s->tmp_depth[0x11] = '\0';
  s->tmp_depth[0x12] = '\0';
  s->tmp_depth[0x13] = '\0';
  s->tmp_depth[0x14] = '\0';
  s->tmp_depth[0x15] = '\0';
  s->tmp_depth[0x16] = '\0';
  s->tmp_depth[0x17] = '\0';
  uVar1 = *(undefined8 *)(s->cmd_depth + 8);
  *(undefined8 *)s->tmp_depth = *(undefined8 *)s->cmd_depth;
  *(undefined8 *)(s->tmp_depth + 0x40) = uVar1;
  *(undefined8 *)(s->tmp_depth + 0x80) = *(undefined8 *)(s->cmd_depth + 0x10);
  *(undefined8 *)(s->tmp_depth + 0xc0) = *(undefined8 *)(s->cmd_depth + 0x18);
  *(undefined8 *)(s->tmp_depth + 0x180) = *(undefined8 *)(s->cmd_depth + 0x20);
  for (lVar15 = 0x328; lVar15 != 0x330; lVar15 = lVar15 + 1) {
    *(uint8_t *)(s->cmd_bits + lVar15 * 4 + 0x28) = s->lit_depth[lVar15];
    *(uint8_t *)(s->cmd_histo + lVar15 * 2 + -0xc) = s->lit_depth[lVar15 + 8];
    *(uint8_t *)(s->cmd_histo + lVar15 * 2 + 0x24) = s->lit_depth[lVar15 + 0x10];
  }
  duckdb_brotli::BrotliStoreHuffmanTree(depth,0x2c0,tree,storage_ix,storage);
  duckdb_brotli::BrotliStoreHuffmanTree(depth_00,0x40,tree,storage_ix,storage);
  return;
}

Assistant:

static void BuildAndStoreCommandPrefixCode(BrotliOnePassArena* s,
    size_t* storage_ix, uint8_t* storage) {
  const uint32_t* const histogram = s->cmd_histo;
  uint8_t* const depth = s->cmd_depth;
  uint16_t* const bits = s->cmd_bits;
  uint8_t* BROTLI_RESTRICT const tmp_depth = s->tmp_depth;
  uint16_t* BROTLI_RESTRICT const tmp_bits = s->tmp_bits;
  /* TODO(eustas): do only once on initialization. */
  memset(tmp_depth, 0, BROTLI_NUM_COMMAND_SYMBOLS);

  BrotliCreateHuffmanTree(histogram, 64, 15, s->tree, depth);
  BrotliCreateHuffmanTree(&histogram[64], 64, 14, s->tree, &depth[64]);
  /* We have to jump through a few hoops here in order to compute
     the command bits because the symbols are in a different order than in
     the full alphabet. This looks complicated, but having the symbols
     in this order in the command bits saves a few branches in the Emit*
     functions. */
  memcpy(tmp_depth, depth, 24);
  memcpy(tmp_depth + 24, depth + 40, 8);
  memcpy(tmp_depth + 32, depth + 24, 8);
  memcpy(tmp_depth + 40, depth + 48, 8);
  memcpy(tmp_depth + 48, depth + 32, 8);
  memcpy(tmp_depth + 56, depth + 56, 8);
  BrotliConvertBitDepthsToSymbols(tmp_depth, 64, tmp_bits);
  memcpy(bits, tmp_bits, 48);
  memcpy(bits + 24, tmp_bits + 32, 16);
  memcpy(bits + 32, tmp_bits + 48, 16);
  memcpy(bits + 40, tmp_bits + 24, 16);
  memcpy(bits + 48, tmp_bits + 40, 16);
  memcpy(bits + 56, tmp_bits + 56, 16);
  BrotliConvertBitDepthsToSymbols(&depth[64], 64, &bits[64]);
  {
    /* Create the bit length array for the full command alphabet. */
    size_t i;
    memset(tmp_depth, 0, 64);  /* only 64 first values were used */
    memcpy(tmp_depth, depth, 8);
    memcpy(tmp_depth + 64, depth + 8, 8);
    memcpy(tmp_depth + 128, depth + 16, 8);
    memcpy(tmp_depth + 192, depth + 24, 8);
    memcpy(tmp_depth + 384, depth + 32, 8);
    for (i = 0; i < 8; ++i) {
      tmp_depth[128 + 8 * i] = depth[40 + i];
      tmp_depth[256 + 8 * i] = depth[48 + i];
      tmp_depth[448 + 8 * i] = depth[56 + i];
    }
    /* TODO(eustas): could/should full-length machinery be avoided? */
    BrotliStoreHuffmanTree(
        tmp_depth, BROTLI_NUM_COMMAND_SYMBOLS, s->tree, storage_ix, storage);
  }
  BrotliStoreHuffmanTree(&depth[64], 64, s->tree, storage_ix, storage);
}